

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

int __thiscall
soplex::SPxBoundFlippingRT<double>::selectLeave
          (SPxBoundFlippingRT<double> *this,double *val,double enterTest,bool polish)

{
  uint uVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  UpdateVector<double> *pUVar4;
  double *pdVar5;
  int *idx;
  double *upp;
  double *low;
  pointer pBVar6;
  pointer pBVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar9;
  undefined1 auVar10 [16];
  LPRowSetBase<double> *pLVar11;
  LPRowSetBase<double> *pLVar12;
  BreakpointSource BVar13;
  BreakpointSource BVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double *pdVar26;
  double stab;
  double dVar27;
  uint local_e8;
  int nBp;
  int leaveIdx;
  int minIdx;
  double local_d8;
  uint local_cc;
  double *local_c8;
  double *local_c0;
  undefined1 local_b8 [16];
  BreakpointCompare compare;
  SPxId baseId;
  Breakpoint tmp;
  
  pSVar3 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  if ((pSVar3->enterCount * -0x3d70a3d7 + 0x51eb850U >> 2 | pSVar3->enterCount * 0x40000000) <
      0x28f5c29) {
    this->flipPotential = 1.0;
  }
  if ((((polish) || ((this->super_SPxFastRT<double>).field_0x51 != '\x01')) ||
      ((this->super_SPxFastRT<double>).field_0x52 != '\x01')) ||
     ((pSVar3->theRep == COLUMN || (this->flipPotential <= 0.0)))) {
    iVar16 = SPxFastRT<double>::selectLeave(&this->super_SPxFastRT<double>,val,enterTest,polish);
    return iVar16;
  }
  auVar10._8_4_ = in_XMM0_Dc;
  auVar10._0_8_ = enterTest;
  auVar10._12_4_ = in_XMM0_Dd;
  pUVar4 = pSVar3->theFvec;
  pdVar5 = (pUVar4->super_VectorBase<double>).val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar26 = (pUVar4->thedelta).super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  idx = (pUVar4->thedelta).super_IdxSet.idx;
  iVar16 = (pUVar4->thedelta).super_IdxSet.num;
  upp = (pSVar3->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  low = (pSVar3->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  leaveIdx = -1;
  local_d8 = *val;
  *val = 0.0;
  nBp = 0;
  minIdx = -1;
  if (local_d8 <= 0.0) {
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar16,pdVar26,pdVar5,upp,low,FVEC);
  }
  else {
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar16,pdVar26,pdVar5,upp,low,FVEC);
  }
  if (nBp == 0) {
    *val = local_d8;
    return leaveIdx;
  }
  pBVar6 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar7 = pBVar6 + minIdx;
  dVar27 = pBVar7->val;
  iVar17 = pBVar7->idx;
  BVar14 = pBVar7->src;
  iVar16 = pBVar6->idx;
  BVar13 = pBVar6->src;
  pBVar7 = pBVar6 + minIdx;
  pBVar7->val = pBVar6->val;
  pBVar7->idx = iVar16;
  pBVar7->src = BVar13;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar7->val = dVar27;
  pBVar7->idx = iVar17;
  pBVar7->src = BVar14;
  if ((enterTest != 0.0) || (NAN(enterTest))) {
    uVar22 = SUB84(ABS(enterTest),0);
    uVar23 = (undefined4)((ulong)ABS(enterTest) >> 0x20);
    uVar21 = auVar10._8_8_ & 0x7fffffffffffffff;
    uVar24 = (undefined4)uVar21;
    uVar25 = (undefined4)(uVar21 >> 0x20);
  }
  else {
    dVar27 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
             instableEnterVal;
    uVar22 = SUB84(dVar27,0);
    uVar23 = (undefined4)((ulong)dVar27 >> 0x20);
    uVar24 = 0;
    uVar25 = 0;
  }
  compare.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_e8 = 0;
  bVar15 = 0 < nBp;
  stab = 0.0;
  iVar16 = 0;
  uVar19 = 0xffffffff;
  dVar27 = (double)CONCAT44(uVar23,uVar22);
  local_c8 = pdVar26;
  if ((0 < nBp) &&
     (pdVar26 = (double *)0x0, iVar16 = 0, dVar27 = (double)CONCAT44(uVar23,uVar22),
     0.0 <= (double)CONCAT44(uVar23,uVar22) && (double)CONCAT44(uVar23,uVar22) != 0.0)) {
    iVar16 = 0;
    do {
      local_b8._8_4_ = uVar24;
      local_b8._0_8_ = dVar27;
      local_b8._12_4_ = uVar25;
      local_c0 = pdVar26;
      if (iVar16 < (int)local_e8) {
        iVar16 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                           ((this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,&compare,iVar16 + 1,nBp,4,0,0,
                            true);
      }
      iVar17 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)local_e8].idx;
      pdVar26 = (double *)ABS(local_c8[iVar17]);
      pSVar3 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      baseId.super_DataKey =
           (pSVar3->super_SPxBasisBase<double>).theBaseId.data[iVar17].super_DataKey;
      iVar17 = SPxLPBase<double>::number(&pSVar3->super_SPxLPBase<double>,&baseId);
      pSVar3 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      pLVar11 = &(pSVar3->super_SPxLPBase<double>).super_LPRowSetBase<double>;
      if (0 < baseId.super_DataKey.info) {
        pLVar11 = (LPRowSetBase<double> *)
                  &(pSVar3->super_SPxLPBase<double>).super_LPColSetBase<double>;
      }
      pLVar12 = (LPRowSetBase<double> *)
                &(pSVar3->super_SPxLPBase<double>).super_LPColSetBase<double>;
      if (baseId.super_DataKey.info < 1) {
        pLVar12 = &(pSVar3->super_SPxLPBase<double>).super_LPRowSetBase<double>;
      }
      uVar24 = local_b8._8_4_;
      uVar25 = local_b8._12_4_;
      dVar27 = local_b8._0_8_ -
               ((pLVar11->right).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar17] * (double)pdVar26 -
               (pLVar12->left).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar17] * (double)pdVar26);
      if ((double)pdVar26 <= (double)local_c0) {
        pdVar26 = local_c0;
      }
      uVar1 = local_e8 + 1;
      bVar15 = (int)uVar1 < nBp;
      stab = (double)pdVar26;
      uVar19 = local_e8;
    } while (((int)uVar1 < nBp) && (local_e8 = uVar1, 0.0 < dVar27));
  }
  local_e8 = uVar19;
  if ((!bVar15) &&
     (pdVar26 = &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta,
     *pdVar26 <= dVar27 && dVar27 != *pdVar26)) {
    this->flipPotential = this->flipPotential + -0.5;
    *val = local_d8;
    iVar16 = SPxFastRT<double>::selectLeave(&this->super_SPxFastRT<double>,val,enterTest,false);
    return iVar16;
  }
  lVar18 = (long)(int)uVar19;
  dVar27 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar18].val;
  lVar20 = lVar18 * 0x10 + 0x18;
  local_cc = 0xffffffff;
  local_c0 = low;
  local_b8._0_8_ = dVar27;
  do {
    uVar19 = uVar19 + 1;
    if ((long)nBp <= lVar18 + 1) break;
    if (iVar16 <= lVar18) {
      iVar16 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         ((this->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,&compare,iVar16 + 1,nBp,4,0,0,
                          true);
      dVar27 = (double)local_b8._0_8_;
    }
    iVar17 = *(int *)((long)&((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start)->val + lVar20);
    dVar2 = local_c8[iVar17];
    if (ABS(dVar2) <= stab) {
      if (0.0 <= (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + dVar27) {
        bVar15 = true;
      }
      else {
        bVar15 = false;
      }
    }
    else {
      pdVar26 = upp;
      if (dVar2 <= 0.0) {
        pdVar26 = local_c0;
      }
      bVar15 = true;
      if ((pdVar26[iVar17] - pdVar5[iVar17]) / dVar2 <= dVar27) {
        stab = ABS(dVar2);
        local_cc = uVar19;
      }
    }
    lVar20 = lVar20 + 0x10;
    lVar18 = lVar18 + 1;
  } while (bVar15);
  pdVar26 = local_c0;
  local_b8._0_8_ = (this->super_SPxFastRT<double>).fastDelta;
  peVar8 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar15 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableEnter;
  this_00 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar27 = peVar8->s_epsilon_multiplier;
  uVar21 = -(ulong)(dVar27 == 1.0);
  dVar27 = (double)(~uVar21 & (ulong)(dVar27 * 1e-10) | uVar21 & 0x3ddb7cdfd9d7bdbb);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (bVar15 == false) {
    dVar27 = (this->super_SPxFastRT<double>).minStab;
    dVar27 = (double)(-(ulong)(stab < 1000.0) & (ulong)dVar27 |
                     ~-(ulong)(stab < 1000.0) & (ulong)((stab * dVar27) / 1000.0));
  }
  local_b8._0_8_ = (double)local_b8._0_8_ / stab;
  if ((int)local_cc < 0) {
    bVar15 = false;
    uVar19 = local_e8;
    if (-1 < (int)local_e8) {
      do {
        iVar16 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_e8].idx;
        if (-1 < iVar16) {
          bVar15 = getData(this,val,&leaveIdx,iVar16,stab,(double)local_b8._0_8_,local_c8,pdVar5,
                           pdVar26,upp,FVEC,local_d8);
        }
        uVar19 = local_e8 - 1;
      } while ((bVar15 == false) && (bVar9 = 0 < (int)local_e8, local_e8 = uVar19, bVar9));
    }
    local_e8 = uVar19 + 1;
  }
  else {
    if (stab <= dVar27) goto LAB_0023a975;
    bVar15 = getData(this,val,&leaveIdx,
                     (this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_cc].idx,stab,
                     (double)local_b8._0_8_,local_c8,pdVar5,pdVar26,upp,FVEC,local_d8);
  }
  if (bVar15 != false) {
    this->relax_count = 0;
    SPxFastRT<double>::tighten(&this->super_SPxFastRT<double>);
    if (((long)(int)local_e8 < 1) ||
       (dVar27 = ABS((this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_e8].val),
       pdVar5 = &(this->super_SPxFastRT<double>).fastDelta, dVar27 < *pdVar5 || dVar27 == *pdVar5))
    {
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
      dVar27 = this->flipPotential + -0.1;
    }
    else {
      flipAndUpdate(this,(int *)&local_e8);
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
           local_e8;
      if ((int)local_e8 < 10) {
        dVar27 = this->flipPotential + -0.05;
      }
      else {
        dVar27 = 1.0;
      }
    }
    this->flipPotential = dVar27;
    return leaveIdx;
  }
LAB_0023a975:
  if (this->relax_count < 2) {
    SPxFastRT<double>::relax(&this->super_SPxFastRT<double>);
    this->relax_count = this->relax_count + 1;
    *val = local_d8;
    leaveIdx = selectLeave(this,val,enterTest,false);
  }
  return leaveIdx;
}

Assistant:

int SPxBoundFlippingRT<R>::selectLeave(
   R&                 val,
   R                  enterTest,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->enterCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DEBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(polish || !enableBoundFlips || !enableRowBoundFlips
         || this->thesolver->rep() == SPxSolverBase<R>::COLUMN || flipPotential <= 0)
   {
      SPxOut::debug(this, "DEBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectLeave(val, enterTest, polish);
   }

   const R*  vec =
      this->thesolver->fVec().get_const_ptr();         /**< pointer to values of current VectorBase<R> */
   const R*  upd =
      this->thesolver->fVec().delta().values();        /**< pointer to update values of current VectorBase<R> */
   const int*   idx =
      this->thesolver->fVec().delta().indexMem();      /**< pointer to indices of current VectorBase<R> */
   int          updnnz =
      this->thesolver->fVec().delta().size();       /**< number of nonzeros in update VectorBase<R> */
   const R*  lb  =
      this->thesolver->lbBound().get_const_ptr();      /**< pointer to lower bound/lhs of current VectorBase<R> */
   const R*  ub  =
      this->thesolver->ubBound().get_const_ptr();      /**< pointer to upper bound/rhs of current VectorBase<R> */

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid leaving index
   int leaveIdx = -1;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   assert(this->thesolver->fVec().delta().isSetup());

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, idx, updnnz, upd, vec, ub, lb, FVEC);
   }

   // return -1 if no BP was found
   if(nBp == 0)
   {
      val = max;
      return leaveIdx;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(enterTest);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableEnterId.isValid());
      // restore original slope
      slope = this->thesolver->instableEnterVal;
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      assert(breakpoints[npassedBp].src == FVEC);
      int breakpointidx = breakpoints[npassedBp].idx;
      // compute new slope
      R upper;
      R lower;
      R absupd = spxAbs(upd[breakpointidx]);
      SPxId baseId = this->thesolver->baseId(breakpointidx);
      int i = this->thesolver->number(baseId);

      if(baseId.isSPxColId())
      {
         upper = this->thesolver->upper(i);
         lower = this->thesolver->lower(i);
      }
      else
      {
         assert(baseId.isSPxRowId());
         upper = this->thesolver->rhs(i);
         lower = this->thesolver->lhs(i);
      }

      slope -= (upper * absupd) - (lower * absupd);

      // get most stable pivot
      if(absupd > moststable)
         moststable = absupd;
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DEBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectLeave(val, enterTest);
   }

   SPxOut::debug(this, "DEBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int breakpointidx = breakpoints[stableBp].idx;
      assert(breakpoints[stableBp].src == FVEC);
      R x = upd[breakpointidx];

      if(spxAbs(x) > moststable)
      {
         stableDelta = (x > 0.0) ? ub[breakpointidx] : lb[breakpointidx];
         stableDelta = (stableDelta - vec[breakpointidx]) / x;

         if(stableDelta <= bestDelta)
         {
            moststable = spxAbs(x);
            bestBp = stableBp;
         }
      }
      // stop searching if the step length is too big
      else if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableEnter;
   assert(!instable || this->thesolver->instableEnterId.isValid());
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int breakpointidx = breakpoints[bestBp].idx;
         assert(breakpointidx >= 0);
         foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                               max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int breakpointidx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(breakpointidx >= 0)
         {
            foundStable = getData(val, leaveIdx, breakpointidx, moststable, degeneps, upd, vec, lb, ub, FVEC,
                                  max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(leaveIdx < 0);

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DEBFRT04 {}: no valid leaveIdx found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectLeave(val, enterTest);
      }
      else
      {
         SPxOut::debug(this, "DEBFRT05 {}: no valid leaveIdx found - breaking...\n",
                       this->thesolver->basis().iteration());
         return leaveIdx;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DEBFRT06 {}: selected Index: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), leaveIdx, nBp);

   return leaveIdx;
}